

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

number_validator<unsigned_char> __thiscall goodform::sub_form::uint8(sub_form *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar2;
  undefined8 *in_RSI;
  number_validator<unsigned_char> nVar3;
  uint8_t val;
  uchar local_61;
  string local_60;
  error_message local_40;
  
  bVar1 = convert<unsigned_char>((any *)in_RSI[1],&local_61);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"NOT A uint8_t","");
    error_message::error_message(&local_40,&local_60);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_40);
    uVar2 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.message_._M_dataplus._M_p != &local_40.message_.field_2) {
      operator_delete(local_40.message_._M_dataplus._M_p,
                      local_40.message_.field_2._M_allocated_capacity + 1);
      uVar2 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      uVar2 = extraout_RDX_02;
    }
  }
  this->error_ = (error_message *)*in_RSI;
  *(uchar *)&this->variant_ = local_61;
  nVar3._8_8_ = uVar2;
  nVar3.error_ = (error_message *)this;
  return nVar3;
}

Assistant:

number_validator<std::uint8_t> sub_form::uint8()
  {
    std::uint8_t val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A uint8_t");
    return number_validator<std::uint8_t>(val, this->error_);
  }